

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O2

void __thiscall
IRC_Bot::setCommandAccessLevels::anon_class_16_2_306f8aac::operator()
          (anon_class_16_2_306f8aac *this,Config *in_section)

{
  IRC_Bot *this_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int accessLevel;
  long lVar4;
  size_type sVar5;
  IRCCommand *pIVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  size_t sVar7;
  long *plVar8;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_prefix;
  basic_string_view<char,_std::char_traits<char>_> in_prefix_00;
  string_view trigger;
  string_view in_string_01;
  string_view in_string_02;
  string_view trigger_00;
  string_view in_string_03;
  string_view trigger_01;
  string_view in_string_04;
  string_view channel;
  
  if (in_section != (Config *)0x0) {
    this_00 = this->this;
    lVar4 = Jupiter::Config::getSection(in_section,8,"Commands");
    if (lVar4 != 0) {
      plVar8 = (long *)(lVar4 + 0x38);
      while (plVar8 = (long *)*plVar8, plVar8 != (long *)0x0) {
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar8 + 1),'.',0);
        pcVar1 = (char *)plVar8[1];
        if (sVar5 == 0xffffffffffffffff) {
          trigger_00._M_str = pcVar1;
          trigger_00._M_len = plVar8[2];
          pIVar6 = getCommand(this_00,trigger_00);
          if ((pIVar6 != (IRCCommand *)0x0) &&
             ((this->in_command == (IRCCommand *)0x0 || (this->in_command == pIVar6)))) {
            in_string_03._M_str = extraout_RDX_01;
            in_string_03._M_len = plVar8[5];
            iVar3 = Jupiter::from_string<int>((Jupiter *)plVar8[6],in_string_03);
            IRCCommand::setAccessLevel(pIVar6,iVar3);
          }
        }
        else {
          sVar7 = plVar8[2] - (sVar5 + 1);
          in_string._M_str = pcVar1 + sVar5 + 1;
          in_string._M_len = sVar7;
          in_prefix._M_str = "Type.";
          in_prefix._M_len = 5;
          bVar2 = jessilib::starts_withi<char,char>(in_string,in_prefix);
          if (bVar2) {
            trigger._M_str = pcVar1;
            trigger._M_len = sVar5;
            pIVar6 = getCommand(this_00,trigger);
            if ((pIVar6 != (IRCCommand *)0x0) &&
               ((this->in_command == (IRCCommand *)0x0 || (this->in_command == pIVar6)))) {
              in_string_01._M_str = extraout_RDX;
              in_string_01._M_len = (size_t)(pcVar1 + sVar5 + 6);
              iVar3 = Jupiter::from_string<int>((Jupiter *)(sVar7 - 5),in_string_01);
              in_string_02._M_str = extraout_RDX_00;
              in_string_02._M_len = plVar8[5];
              accessLevel = Jupiter::from_string<int>((Jupiter *)plVar8[6],in_string_02);
              IRCCommand::setAccessLevel(pIVar6,iVar3,accessLevel);
            }
          }
          else {
            in_string_00._M_str = pcVar1 + sVar5 + 1;
            in_string_00._M_len = sVar7;
            in_prefix_00._M_str = "Channel.";
            in_prefix_00._M_len = 8;
            bVar2 = jessilib::starts_withi<char,char>(in_string_00,in_prefix_00);
            if (bVar2) {
              trigger_01._M_str = pcVar1;
              trigger_01._M_len = sVar5;
              pIVar6 = getCommand(this_00,trigger_01);
              if ((pIVar6 != (IRCCommand *)0x0) &&
                 ((this->in_command == (IRCCommand *)0x0 || (this->in_command == pIVar6)))) {
                in_string_04._M_str = extraout_RDX_02;
                in_string_04._M_len = plVar8[5];
                iVar3 = Jupiter::from_string<int>((Jupiter *)plVar8[6],in_string_04);
                channel._M_str = pcVar1 + sVar5 + 9;
                channel._M_len = sVar7 - 8;
                IRCCommand::setAccessLevel(pIVar6,channel,iVar3);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void IRC_Bot::setCommandAccessLevels(IRCCommand *in_command) {
	auto set_command_access_levels = [this, in_command](Jupiter::Config *in_section) {
		if (in_section == nullptr) {
			return;
		}

		Jupiter::Config *section = in_section->getSection("Commands"sv);
		if (section == nullptr) {
			return;
		}

		for (auto& entry : section->getTable()) {
			size_t tmp_index;
			std::string_view tmp_key, tmp_sub_key;
			IRCCommand *command;

			tmp_index = entry.first.find('.');
			if (tmp_index != std::string_view::npos) {
				// non-default access assignment

				tmp_key = std::string_view(entry.first.data(), tmp_index);

				tmp_sub_key = entry.first;
				tmp_sub_key.remove_prefix(tmp_index + 1);

				if (jessilib::starts_withi(tmp_sub_key, "Type."sv)) {
					tmp_sub_key.remove_prefix(5); // strip "Type."

					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command)) {
						command->setAccessLevel(Jupiter::from_string<int>(tmp_sub_key), Jupiter::from_string<int>(entry.second));
					}
				}
				else if (jessilib::starts_withi(tmp_sub_key, "Channel."sv)) {
					tmp_sub_key.remove_prefix(8); // strip "Channel."

					// Assign access level to command (if command exists)
					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command))
						command->setAccessLevel(tmp_sub_key, Jupiter::from_string<int>(entry.second));
				}
			}
			else {
				// Assign access level to command (if command exists)
				command = this->getCommand(entry.first);
				if (command != nullptr && (in_command == nullptr || in_command == command))
					command->setAccessLevel(Jupiter::from_string<int>(entry.second));
			}
		};
	};

	set_command_access_levels(getSecondaryConfigSection());
	set_command_access_levels(getPrimaryConfigSection());
}